

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_Overlay(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int layer;
  player_t *this;
  bool bVar2;
  DPSprite *pDVar3;
  FState *newstate;
  char *pcVar4;
  AActor *caller;
  int val;
  AActor *this_00;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_004c7e51;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_004c7e19;
  this_00 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_004c7c42;
    bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004c7e51;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_004c7e19;
LAB_004c7c42:
    this_00 = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    caller = this_00;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_004c7e19:
        pcVar4 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_004c7e51;
      }
      caller = (AActor *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (caller != (AActor *)0x0) {
          bVar2 = DObject::IsKindOf((DObject *)caller,AActor::RegistrationInfo.MyClass);
          if (!bVar2) {
            pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_004c7e51;
          }
          goto LAB_004c7ca5;
        }
      }
      else if (caller != (AActor *)0x0) goto LAB_004c7e19;
      caller = (AActor *)0x0;
    }
LAB_004c7ca5:
    if (2 < (uint)numparam) {
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 != 0xff) &&
         ((VVar1 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        pcVar4 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_004c7e51:
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (numparam != 3) {
        if (param[3].field_0.field_3.Type != '\0') {
          pcVar4 = "param[paramnum].Type == REGT_INT";
          goto LAB_004c7e32;
        }
        layer = param[3].field_0.i;
        if (numparam == 4) {
          newstate = (FState *)0x0;
        }
        else {
          VVar1 = param[4].field_0.field_3.Type;
          if (VVar1 == 0xff) {
LAB_004c7d2b:
            newstate = (FState *)0x0;
          }
          else {
            if (VVar1 != '\x03') {
LAB_004c7e69:
              __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x47d,
                            "int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
            newstate = (FState *)param[4].field_0.field_1.a;
            if (param[4].field_0.field_1.atag != 7) {
              if (newstate != (FState *)0x0) goto LAB_004c7e69;
              goto LAB_004c7d2b;
            }
          }
          if (5 < (uint)numparam) {
            VVar1 = param[5].field_0.field_3.Type;
            if (VVar1 == '\0') {
              bVar2 = param[5].field_0.i != 0;
              goto LAB_004c7d4d;
            }
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x47e,
                            "int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
        }
        bVar2 = false;
LAB_004c7d4d:
        this = this_00->player;
        val = 1;
        if ((this == (player_t *)0x0) ||
           ((bVar2 && (pDVar3 = player_t::FindPSprite(this,layer), pDVar3 != (DPSprite *)0x0)))) {
          if (numret < 1) {
            return 0;
          }
          val = 0;
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x484,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
        }
        else {
          pDVar3 = (DPSprite *)DObject::operator_new(0x88);
          DPSprite::DPSprite(pDVar3,this,caller,layer);
          DPSprite::SetState(pDVar3,newstate,false);
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x48a,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
        }
        VMReturn::SetInt(ret,val);
        return 1;
      }
    }
  }
  pcVar4 = "(paramnum) < numparam";
LAB_004c7e32:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x47c,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT		(layer);
	PARAM_STATE_OPT	(state) { state = nullptr; }
	PARAM_BOOL_OPT	(dontoverride)	{ dontoverride = false; }

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}